

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_test.hpp
# Opt level: O0

void __thiscall
test_impl::
R<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_&>
::oops<int>(R<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_&>
            *this,int *u)

{
  ostream *poVar1;
  __ostream_type *p_Var2;
  int *piVar3;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_28;
  streamable<int> local_20;
  int *local_18;
  int *u_local;
  R<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_&>
  *this_local;
  
  local_18 = u;
  u_local = (int *)this;
  poVar1 = std::operator<<((ostream *)&std::cerr,"> ERROR: CHECK failed \"");
  poVar1 = std::operator<<(poVar1,this->expr_);
  poVar1 = std::operator<<(poVar1,"\"\n");
  poVar1 = std::operator<<(poVar1,"> \t");
  poVar1 = std::operator<<(poVar1,this->filename_);
  poVar1 = std::operator<<(poVar1,'(');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->lineno_);
  poVar1 = std::operator<<(poVar1,')');
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(poVar1,"> \t in function \"");
  poVar1 = std::operator<<(poVar1,this->func_);
  std::operator<<(poVar1,"\"\n");
  if ((this->dismissed_ & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"> \tEXPECTED: ");
    local_20 = stream<int>(local_18);
    p_Var2 = ({parm#1}<<((std::declval<std::remove_reference<int>::type_const&>)()))test_impl::
             operator<<(poVar1,&local_20);
    poVar1 = std::operator<<(p_Var2,"\n> \tACTUAL: ");
    local_28 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)stream<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                            (this->t_);
    poVar1 = test_impl::operator<<
                       (poVar1,(streamable_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                *)&local_28);
    std::operator<<(poVar1,'\n');
  }
  piVar3 = test_failures();
  *piVar3 = *piVar3 + 1;
  return;
}

Assistant:

void oops(U const &u) const
        {
            std::cerr
                << "> ERROR: CHECK failed \"" << expr_ << "\"\n"
                << "> \t" << filename_ << '(' << lineno_ << ')' << '\n'
                << "> \t in function \"" << func_ << "\"\n";
            if(dismissed_)
                std::cerr
                    << "> \tEXPECTED: " << stream(u) << "\n> \tACTUAL: " << stream(t_) << '\n';
            ++test_failures();
        }